

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_strategy ZVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  void *pvVar3;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  undefined4 uVar12;
  U32 UVar13;
  U32 end;
  int iVar14;
  uint uVar15;
  U32 UVar16;
  ZSTD_TraceCtx ZVar17;
  size_t sVar18;
  size_t sVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  size_t sVar23;
  ZSTD_matchState_t *dstMatchState;
  U32 *workspace;
  ZSTD_CCtx_params local_e0;
  
  sVar19 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar19 = cdict->dictContentSize;
  }
  ZVar17 = ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar17;
  if ((((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff && (cdict->dictContentSize * 6 <= pledgedSrcSize)) &&
        (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    sVar18 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar19,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar18) {
      return sVar18;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      workspace = cctx->entropyWorkspace;
    }
    else {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      workspace = cctx->entropyWorkspace;
      dictSize = cdict->dictContentSize;
    }
    sVar18 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        workspace);
    if (sVar18 < 0xffffffffffffff89) {
      cctx->dictID = (U32)sVar18;
      cctx->dictContentSize = sVar19;
      return 0;
    }
    return sVar18;
  }
  iVar14 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
  if (iVar14 == 0) {
    memcpy(&local_e0,params,0xb0);
    uVar6 = (cdict->matchState).cParams.chainLog;
    uVar7 = (cdict->matchState).cParams.hashLog;
    uVar8 = (cdict->matchState).cParams.searchLog;
    uVar9 = (cdict->matchState).cParams.minMatch;
    local_e0.cParams.targetLength = (cdict->matchState).cParams.targetLength;
    local_e0.cParams.strategy = (cdict->matchState).cParams.strategy;
    local_e0.cParams.chainLog = uVar6;
    local_e0.useRowMatchFinder = cdict->useRowMatchFinder;
    local_e0.cParams.hashLog = uVar7;
    local_e0.cParams.searchLog = uVar8;
    local_e0.cParams.minMatch = uVar9;
    sVar19 = ZSTD_resetCCtx_internal(cctx,&local_e0,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
    if (0xffffffffffffff88 < sVar19) {
      return sVar19;
    }
    (cctx->workspace).tableValidEnd = (cctx->workspace).objectEnd;
    ZVar1 = (cdict->matchState).cParams.strategy;
    if ((ZVar1 == ZSTD_fast) ||
       ((ZVar1 - ZSTD_greedy < 3 && (cdict->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder)))) {
      sVar23 = 0;
    }
    else {
      sVar23 = 4L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
    }
    bVar21 = (byte)(cdict->matchState).cParams.hashLog;
    memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
           4L << (bVar21 & 0x3f));
    ZVar1 = (cctx->appliedParams).cParams.strategy;
    if ((ZVar1 != ZSTD_fast) &&
       ((2 < ZVar1 - ZSTD_greedy ||
        ((cctx->appliedParams).useRowMatchFinder != ZSTD_urm_enableRowMatchFinder)))) {
      memcpy((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar23);
    }
    if ((0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2) &&
       (cdict->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder)) {
      memcpy((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,
             2L << (bVar21 & 0x3f));
    }
    UVar16 = (cctx->blockState).matchState.hashLog3;
    sVar23 = 0;
    if (UVar16 != 0) {
      sVar23 = 4L << ((byte)UVar16 & 0x3f);
    }
    memset((cctx->blockState).matchState.hashTable3,0,sVar23);
    pvVar3 = (cctx->workspace).tableEnd;
    if ((cctx->workspace).tableValidEnd < pvVar3) {
      (cctx->workspace).tableValidEnd = pvVar3;
    }
    uVar12 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
    (cctx->blockState).matchState.window.nbOverflowCorrections =
         (cdict->matchState).window.nbOverflowCorrections;
    *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar12;
    pBVar10 = (cdict->matchState).window.nextSrc;
    pBVar11 = (cdict->matchState).window.base;
    UVar16 = (cdict->matchState).window.dictLimit;
    UVar13 = (cdict->matchState).window.lowLimit;
    (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
    (cctx->blockState).matchState.window.dictLimit = UVar16;
    (cctx->blockState).matchState.window.lowLimit = UVar13;
    (cctx->blockState).matchState.window.nextSrc = pBVar10;
    (cctx->blockState).matchState.window.base = pBVar11;
    (cctx->blockState).matchState.nextToUpdate = (cdict->matchState).nextToUpdate;
    UVar16 = (cdict->matchState).loadedDictEnd;
  }
  else {
    memcpy(&local_e0,params,0xb0);
    uVar15 = (cdict->matchState).cParams.hashLog;
    local_e0.cParams.strategy = (cdict->matchState).cParams.strategy;
    local_e0.cParams.hashLog = uVar15;
    if ((cdict->matchState).dedicatedDictSearch != 0) {
      local_e0.cParams.hashLog = 6;
      if (6 < uVar15 - 2) {
        local_e0.cParams.hashLog = uVar15 - 2;
      }
      if (2 < local_e0.cParams.strategy - ZSTD_greedy) {
        local_e0.cParams.hashLog = uVar15;
      }
    }
    uVar15 = (cdict->matchState).cParams.windowLog;
    uVar22 = uVar15;
    if (pledgedSrcSize < 0x40000000) {
      uVar22 = (int)pledgedSrcSize - 1;
      uVar5 = 0x1f;
      if (uVar22 != 0) {
        for (; uVar22 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar22 = 6;
      if (0x3f < pledgedSrcSize) {
        uVar22 = (uVar5 ^ 0xffffffe0) + 0x21;
      }
      if (uVar15 < uVar22) {
        uVar22 = uVar15;
      }
    }
    local_e0.cParams.chainLog = (cdict->matchState).cParams.chainLog;
    if (pledgedSrcSize != 0xffffffffffffffff) {
      uVar15 = uVar22 + 1;
      if (local_e0.cParams.hashLog < uVar22 + 1) {
        uVar15 = local_e0.cParams.hashLog;
      }
      local_e0.cParams.hashLog = uVar15;
      if (uVar22 < (local_e0.cParams.chainLog - 1) +
                   (uint)(local_e0.cParams.strategy < ZSTD_btlazy2)) {
        local_e0.cParams.chainLog = (uVar22 + 1) - (uint)(local_e0.cParams.strategy < ZSTD_btlazy2);
      }
    }
    uVar2 = (cdict->matchState).cParams.searchLog;
    uVar4 = (cdict->matchState).cParams.minMatch;
    local_e0.cParams.targetLength = (cdict->matchState).cParams.targetLength;
    local_e0.useRowMatchFinder = cdict->useRowMatchFinder;
    local_e0.cParams.searchLog = uVar2;
    local_e0.cParams.minMatch = uVar4;
    sVar19 = ZSTD_resetCCtx_internal(cctx,&local_e0,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar19) {
      return sVar19;
    }
    uVar20 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
    uVar15 = (uint)uVar20;
    if ((cdict->matchState).window.dictLimit == uVar15) goto LAB_005f83e2;
    (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
    if ((cctx->blockState).matchState.window.dictLimit < uVar15) {
      (cctx->blockState).matchState.window.nextSrc =
           (cctx->blockState).matchState.window.base + (uVar20 & 0xffffffff);
      (cctx->blockState).matchState.window.lowLimit = uVar15;
      (cctx->blockState).matchState.window.dictLimit = uVar15;
    }
    UVar16 = (cctx->blockState).matchState.window.dictLimit;
  }
  (cctx->blockState).matchState.loadedDictEnd = UVar16;
LAB_005f83e2:
  cctx->dictID = cdict->dictID;
  cctx->dictContentSize = cdict->dictContentSize;
  memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}